

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ImDrawVert *pIVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  unsigned_short *puVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec2 triangle [3];
  undefined8 local_98;
  ImVec2 local_88;
  ImVec2 local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58._0_4_ = (draw_cmd->ClipRect).x;
  local_58._4_4_ = (draw_cmd->ClipRect).y;
  uStack_50 = 0;
  local_48._0_4_ = (draw_cmd->ClipRect).z;
  local_48._4_4_ = (draw_cmd->ClipRect).w;
  uStack_40 = 0;
  uVar2 = out_draw_list->Flags;
  out_draw_list->Flags = uVar2 & 0xfffffffe;
  uVar3 = draw_cmd->IdxOffset;
  uVar10 = (ulong)uVar3;
  uVar11 = draw_cmd->ElemCount + uVar3;
  auVar21 = _DAT_0017b860;
  auVar22 = _DAT_0017b7c0;
  if (uVar3 < uVar11) {
    do {
      if ((draw_list->IdxBuffer).Size < 1) {
        puVar7 = (unsigned_short *)0x0;
      }
      else {
        puVar7 = (draw_list->IdxBuffer).Data;
      }
      uVar3 = draw_cmd->VtxOffset;
      pIVar4 = (draw_list->VtxBuffer).Data;
      local_78[0].x = 0.0;
      local_78[0].y = 0.0;
      local_78[1].x = 0.0;
      local_78[1].y = 0.0;
      local_78[2].x = 0.0;
      local_78[2].y = 0.0;
      lVar9 = 0;
      fVar12 = auVar22._0_4_;
      fVar13 = auVar22._4_4_;
      uVar14 = auVar22._8_4_;
      uVar15 = auVar22._12_4_;
      fVar16 = auVar21._0_4_;
      fVar17 = auVar21._4_4_;
      uVar18 = auVar21._8_4_;
      uVar19 = auVar21._12_4_;
      do {
        uVar1 = lVar9 + (uVar10 & 0xffffffff);
        uVar8 = (uint)uVar1;
        if (puVar7 != (unsigned_short *)0x0) {
          uVar8 = (uint)puVar7[uVar1 & 0xffffffff];
        }
        IVar5 = pIVar4[(ulong)uVar3 + (ulong)uVar8].pos;
        local_78[lVar9] = IVar5;
        auVar20._8_8_ = 0;
        auVar20._0_4_ = IVar5.x;
        auVar20._4_4_ = IVar5.y;
        auVar21._4_4_ = fVar13;
        auVar21._0_4_ = fVar12;
        auVar21._8_4_ = uVar14;
        auVar21._12_4_ = uVar15;
        auVar22 = minps(auVar20,auVar21);
        auVar6._4_4_ = fVar17;
        auVar6._0_4_ = fVar16;
        auVar6._8_4_ = uVar18;
        auVar6._12_4_ = uVar19;
        auVar21 = maxps(auVar20,auVar6);
        lVar9 = lVar9 + 1;
        fVar12 = auVar22._0_4_;
        fVar13 = auVar22._4_4_;
        uVar14 = auVar22._8_4_;
        uVar15 = auVar22._12_4_;
        fVar16 = auVar21._0_4_;
        fVar17 = auVar21._4_4_;
        uVar18 = auVar21._8_4_;
        uVar19 = auVar21._12_4_;
      } while (lVar9 != 3);
      if (show_mesh) {
        ImDrawList::AddPolyline(out_draw_list,local_78,3,0xff00ffff,1,1.0);
      }
      uVar10 = (uVar10 & 0xffffffff) + 3;
    } while ((uint)uVar10 < uVar11);
    local_88.y = (float)(int)fVar13;
    local_88.x = (float)(int)fVar12;
    local_98 = CONCAT44((float)(int)fVar17,(float)(int)fVar16);
  }
  if (show_aabb) {
    local_78[0].y = (float)(int)local_58._4_4_;
    local_78[0].x = (float)(int)(float)local_58;
    local_78[3] = (ImVec2)CONCAT44((float)(int)local_48._4_4_,(float)(int)(float)local_48);
    ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffff00ff,0.0,0,1.0);
    local_78[0] = local_88;
    local_78[3].x = (float)(undefined4)local_98;
    local_78[3].y = (float)local_98._4_4_;
    ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffffff00,0.0,0,1.0);
  }
  out_draw_list->Flags = uVar2;
  return;
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset, idx_end = draw_cmd->IdxOffset + draw_cmd->ElemCount; idx_n < idx_end; )
    {
        ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL; // We don't hold on those pointers past iterations as ->AddPolyline() may invalidate them if out_draw_list==draw_list
        ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}